

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void * __thiscall CVmGramProdMem::alloc(CVmGramProdMem *this,size_t siz)

{
  size_t sVar1;
  void *pvVar2;
  size_t in_RSI;
  undefined8 *in_RDI;
  void *ret;
  void *local_8;
  
  sVar1 = osrndsz(in_RSI);
  if (sVar1 < 0x4001) {
    if ((ulong)in_RDI[3] < sVar1) {
      if (in_RDI[1] == 0) {
        pvVar2 = malloc(0x4008);
        *in_RDI = pvVar2;
        in_RDI[1] = *in_RDI;
        *(undefined8 *)in_RDI[1] = 0;
      }
      else if (*(long *)in_RDI[1] == 0) {
        pvVar2 = malloc(0x4008);
        *(void **)in_RDI[1] = pvVar2;
        in_RDI[1] = *(undefined8 *)in_RDI[1];
        *(undefined8 *)in_RDI[1] = 0;
      }
      else {
        in_RDI[1] = *(undefined8 *)in_RDI[1];
      }
      in_RDI[2] = in_RDI[1] + 8;
      in_RDI[3] = 0x4000;
    }
    local_8 = (void *)in_RDI[2];
    in_RDI[2] = sVar1 + in_RDI[2];
    in_RDI[3] = in_RDI[3] - sVar1;
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *alloc(size_t siz)
    {
        void *ret;
        
        /* round the size to the local hardware boundary */
        siz = osrndsz(siz);

        /* if it exceeds the block size, fail */
        if (siz > VMGRAMPROD_MEM_BLOCK_SIZE)
            return 0;

        /* if we don't have enough space in this block, go to the next */
        if (siz > cur_rem_)
        {
            /* allocate a new block if necessary */
            if (block_cur_ == 0)
            {
                /* there's nothing in the list yet - set up the first block */
                block_head_ = (CVmGramProdMemBlock *)
                              t3malloc(sizeof(CVmGramProdMemBlock));

                /* activate the new block */
                block_cur_ = block_head_;

                /* there's nothing after this block */
                block_cur_->nxt_ = 0;
            }
            else if (block_cur_->nxt_ == 0)
            {
                /* we're at the end of the list - add a block */
                block_cur_->nxt_ = (CVmGramProdMemBlock *)
                                   t3malloc(sizeof(CVmGramProdMemBlock));

                /* advance to the new block */
                block_cur_ = block_cur_->nxt_;

                /* the new block is the last in the chain */
                block_cur_->nxt_ = 0;
            }
            else
            {
                /* another block follows - advance to it */
                block_cur_ = block_cur_->nxt_;
            }

            /* start at the beginning of the new block */
            cur_free_ = block_cur_->buf_;

            /* this entire block is available */
            cur_rem_ = VMGRAMPROD_MEM_BLOCK_SIZE;
        }

        /* the return value will be the current free pointer */
        ret = cur_free_;

        /* consume the space */
        cur_free_ += siz;
        cur_rem_ -= siz;

        /* return the block location */
        return ret;
    }